

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O1

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
          *m,PositionMeasurement<float> *z)

{
  float *this_00;
  float *K_00;
  float fVar1;
  float fVar2;
  undefined1 local_d0 [8];
  SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> sigmaMeasurementPoints;
  KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> K;
  undefined1 local_58 [8];
  Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> P_yy;
  PositionMeasurement<float> y;
  sub_assign_op<float,_float> local_31;
  
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeSigmaPointMeasurements<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)this,m,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_d0);
  this_00 = P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
            + 2;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_ =
       (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_d0;
  Vector<float,2>::
  Vector<Eigen::Product<Eigen::Matrix<float,2,7,0,2,7>,Eigen::Matrix<float,7,1,0,7,1>,0>>
            ((Vector<float,_2> *)this_00,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_Eigen::Matrix<float,_7,_1,_0,_7,_1>,_0>_>
              *)(K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                 array + 4));
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)this_00,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_d0,
             &(m->super_StandardBase<KalmanExamples::Robot1::PositionMeasurement<float>_>).P,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_58);
  K_00 = sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
         m_storage.m_data.array + 0xc;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)this_00,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_d0,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_58,
             (KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)K_00);
  fVar2 = (z->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] -
          P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
  ;
  fVar1 = (z->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] -
          P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
  ;
  *(float *)this =
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] *
       fVar1 + sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
               m_storage.m_data.array[0xc] * fVar2 + *(float *)this;
  *(float *)(this + 4) =
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] *
       fVar1 + sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
               m_storage.m_data.array[0xd] * fVar2 + *(float *)(this + 4);
  *(float *)(this + 8) =
       fVar1 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               [3] +
       fVar2 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               [0] + *(float *)(this + 8);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_ = K_00
  ;
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Product<Eigen::Product<Eigen::Matrix<float,3,2,0,3,2>,Eigen::Matrix<float,2,2,0,2,2>,0>,Eigen::Transpose<Eigen::Matrix<float,3,2,0,3,2>const>,0>,Eigen::internal::sub_assign_op<float,float>>
            ((Matrix<float,_3,_3,_0,_3,_3> *)(this + 0xac),
             (Product<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::Matrix<float,_2,_2,_0,_2,_2>,_0>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_2,_0,_3,_2>_>,_0>
              *)(K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                 array + 4),&local_31,(type)0x0);
  return (State *)this;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }